

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O3

void xsurv0_pipe_fini(void *arg)

{
  nni_aio_fini((nni_aio *)((long)arg + 0x28));
  nni_aio_fini((nni_aio *)((long)arg + 0x3b8));
  nni_aio_fini((nni_aio *)((long)arg + 0x580));
  nni_aio_fini((nni_aio *)((long)arg + 0x1f0));
  nni_msgq_fini(*(nni_msgq **)((long)arg + 0x10));
  return;
}

Assistant:

static void
xsurv0_pipe_fini(void *arg)
{
	xsurv0_pipe *p = arg;

	nni_aio_fini(&p->aio_getq);
	nni_aio_fini(&p->aio_send);
	nni_aio_fini(&p->aio_recv);
	nni_aio_fini(&p->aio_putq);
	nni_msgq_fini(p->sendq);
}